

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

optional<pbrt::SquareMatrix<3>_> * __thiscall
pbrt::PixelSensor::SolveXYZFromSensorRGB
          (PixelSensor *this,SpectrumHandle *sensorIllum,SpectrumHandle *outputIllum)

{
  undefined1 auVar1 [64];
  ulong uVar2;
  size_type sVar3;
  Float *pFVar4;
  SpectrumHandle *in_RCX;
  SpectrumHandle *in_RSI;
  optional<pbrt::SquareMatrix<3>_> *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 extraout_var [60];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  RGB RVar9;
  XYZ XVar10;
  int c_1;
  XYZ xyz;
  SpectrumHandle s;
  size_t i_1;
  Float sensorWhiteY;
  Float sensorWhiteG;
  int c;
  RGB rgb;
  size_t i;
  RGB outputWhite;
  Float xyzOutput [24] [3];
  Float rgbCamera [24] [3];
  DenselySampledSpectrum *in_stack_fffffffffffffbc8;
  SpectrumHandle *in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  XYZ *this_00;
  SpectrumHandle *in_stack_fffffffffffffbe8;
  SpectrumHandle *in_stack_fffffffffffffbf0;
  optional<pbrt::SquareMatrix<3>_> *b1;
  SpectrumHandle *refl;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  int iVar11;
  PixelSensor *in_stack_fffffffffffffc80;
  XYZ local_32c;
  XYZ local_320;
  Float (*in_stack_fffffffffffffcf0) [3];
  Float (*in_stack_fffffffffffffcf8) [3];
  int local_2e4;
  RGB local_2a4;
  ulong local_298;
  undefined8 local_290;
  Float local_288;
  SpectrumHandle local_280;
  undefined8 local_274;
  Float local_26c;
  Float local_268 [72];
  Float local_148 [82];
  
  auVar8 = in_ZMM0._8_56_;
  refl = &local_280;
  b1 = in_RDI;
  SpectrumHandle::SpectrumHandle
            (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
  RVar9 = IlluminantToSensorRGB
                    (in_stack_fffffffffffffc80,
                     (SpectrumHandle *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                    );
  local_288 = RVar9.b;
  auVar5._0_8_ = RVar9._0_8_;
  auVar5._8_56_ = auVar8;
  local_290 = vmovlpd_avx(auVar5._0_16_);
  local_298 = 0;
  local_274 = local_290;
  local_26c = local_288;
  while( true ) {
    uVar2 = local_298;
    auVar8 = auVar5._8_56_;
    sVar3 = std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::size
                      ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                       swatchReflectances);
    if (sVar3 <= uVar2) break;
    std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::operator[]
              ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
               swatchReflectances,local_298);
    SpectrumHandle::SpectrumHandle
              (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
    SpectrumHandle::SpectrumHandle
              (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    RVar9 = ProjectReflectance<pbrt::RGB>
                      (refl,in_RSI,(SpectrumHandle *)b1,(SpectrumHandle *)in_RDI,in_RCX);
    local_2a4.b = RVar9.b;
    auVar5._0_8_ = RVar9._0_8_;
    auVar5._8_56_ = auVar8;
    local_2a4._0_8_ = vmovlpd_avx(auVar5._0_16_);
    for (local_2e4 = 0; local_2e4 < 3; local_2e4 = local_2e4 + 1) {
      pFVar4 = RGB::operator[](&local_2a4,local_2e4);
      auVar5 = ZEXT464((uint)*pFVar4);
      local_148[local_298 * 3 + (long)local_2e4] = *pFVar4;
    }
    local_298 = local_298 + 1;
  }
  SpectrumHandle::SpectrumHandle
            (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  InnerProduct(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  SpectrumHandle::SpectrumHandle
            (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
  Spectra::Y();
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  InnerProduct(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  auVar1._60_4_ = 0;
  auVar1._0_60_ = extraout_var;
  auVar7 = auVar1 << 0x20;
  stack0xfffffffffffffce8 = 0;
  while( true ) {
    uVar2 = stack0xfffffffffffffce8;
    auVar8 = auVar7._8_56_;
    sVar3 = std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::size
                      ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                       swatchReflectances);
    if (sVar3 <= uVar2) break;
    std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::operator[]
              ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
               swatchReflectances,stack0xfffffffffffffce8);
    this_00 = &local_320;
    SpectrumHandle::SpectrumHandle
              (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
    SpectrumHandle::SpectrumHandle
              (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
    SpectrumHandle::SpectrumHandle
              (in_stack_fffffffffffffbd0,(SpectrumHandle *)in_stack_fffffffffffffbc8);
    Spectra::X();
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    Spectra::Y();
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    Spectra::Z();
    SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    XVar10 = ProjectReflectance<pbrt::XYZ>
                       (refl,in_RSI,(SpectrumHandle *)b1,(SpectrumHandle *)in_RDI,in_RCX);
    auVar6._0_8_ = XVar10._0_8_;
    auVar6._8_56_ = auVar8;
    vmovlpd_avx(auVar6._0_16_);
    auVar8 = ZEXT856(0);
    XVar10 = XYZ::operator*(this_00,(Float)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    local_32c.Z = XVar10.Z;
    auVar7._0_8_ = XVar10._0_8_;
    auVar7._8_56_ = auVar8;
    local_32c._0_8_ = vmovlpd_avx(auVar7._0_16_);
    for (iVar11 = 0; iVar11 < 3; iVar11 = iVar11 + 1) {
      pFVar4 = XYZ::operator[](&local_32c,iVar11);
      auVar7 = ZEXT464((uint)*pFVar4);
      local_268[stack0xfffffffffffffce8 * 3 + (long)iVar11] = *pFVar4;
    }
    register0x00000000 = stack0xfffffffffffffce8 + 1;
  }
  std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::size
            ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
             swatchReflectances);
  sVar3 = stack0xfffffffffffffce8;
  uVar2 = stack0xfffffffffffffce8 >> 0x20;
  iVar11 = (int)uVar2;
  unique0x100006b9 = sVar3;
  LinearLeastSquares(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar11);
  return b1;
}

Assistant:

pstd::optional<SquareMatrix<3>> PixelSensor::SolveXYZFromSensorRGB(
    SpectrumHandle sensorIllum, SpectrumHandle outputIllum) const {
    Float rgbCamera[24][3], xyzOutput[24][3];
    // Compute _rgbCamera_ values for training swatches
    RGB outputWhite = IlluminantToSensorRGB(outputIllum);
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        RGB rgb = ProjectReflectance<RGB>(swatchReflectances[i], sensorIllum, &r_bar,
                                          &g_bar, &b_bar);
        for (int c = 0; c < 3; ++c)
            rgbCamera[i][c] = rgb[c];
    }

    // Compute _xyzOutput_ values for training swatches
    Float sensorWhiteG = InnerProduct(sensorIllum, &g_bar);
    Float sensorWhiteY = InnerProduct(sensorIllum, &Spectra::Y());
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        SpectrumHandle s = swatchReflectances[i];
        XYZ xyz = ProjectReflectance<XYZ>(s, outputIllum, &Spectra::X(), &Spectra::Y(),
                                          &Spectra::Z()) *
                  (sensorWhiteY / sensorWhiteG);
        for (int c = 0; c < 3; ++c)
            xyzOutput[i][c] = xyz[c];
    }

    return LinearLeastSquares(rgbCamera, xyzOutput, swatchReflectances.size());
}